

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_points.cpp
# Opt level: O0

Am_Point_List * __thiscall Am_Point_List::operator=(Am_Point_List *this,Am_Value *in_value)

{
  Am_ID_Tag AVar1;
  Am_ID_Tag AVar2;
  Am_Value *in_value_local;
  Am_Point_List *this_local;
  
  if (this->data != (Am_Point_List_Data *)0x0) {
    Am_Wrapper::Release(&this->data->super_Am_Wrapper);
  }
  this->data = (Am_Point_List_Data *)in_value->value;
  this->item = (Am_Point_Item *)0x0;
  if (this->data != (Am_Point_List_Data *)0x0) {
    AVar1 = in_value->type;
    AVar2 = Am_Point_List_Data::Am_Point_List_Data_ID();
    if ((AVar1 != AVar2) && (in_value->type != 1)) {
      Am_Error("** Tried to set a Am_Point_List with a non Am_Point_List wrapper.");
    }
    Am_Wrapper::Note_Reference(&this->data->super_Am_Wrapper);
  }
  return this;
}

Assistant:

Am_Point_List &
Am_Point_List::operator=(const Am_Value &in_value)
{
  if (data)
    data->Release();
  data = (Am_Point_List_Data *)in_value.value.wrapper_value;
  item = nullptr;
  if (data) {
    if (in_value.type != Am_Point_List_Data::Am_Point_List_Data_ID() &&
        in_value.type != Am_ZERO)
      Am_Error("** Tried to set a Am_Point_List with a non "
               "Am_Point_List wrapper.");
    data->Note_Reference();
  }
  return *this;
}